

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeEventPoolGetFlags(ze_event_pool_handle_t hEventPool,ze_event_pool_flags_t *pFlags)

{
  ze_result_t zVar1;
  
  if (DAT_0010d590 != (code *)0x0) {
    zVar1 = (*DAT_0010d590)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolGetFlags(
        ze_event_pool_handle_t hEventPool,              ///< [in] handle of the event pool
        ze_event_pool_flags_t* pFlags                   ///< [out] creation flags used to create the event pool; may be 0 or a
                                                        ///< valid combination of ::ze_event_pool_flag_t
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetFlags = context.zeDdiTable.EventPool.pfnGetFlags;
        if( nullptr != pfnGetFlags )
        {
            result = pfnGetFlags( hEventPool, pFlags );
        }
        else
        {
            // generic implementation
        }

        return result;
    }